

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O2

int smf_save(smf_t *smf,char *file_name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  smf_track_t *psVar5;
  smf_event_t *psVar6;
  undefined8 *puVar7;
  FILE *__s;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  smf_track_t *psVar11;
  smf_event_t *psVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  ushort uVar16;
  int iVar17;
  uchar *puVar18;
  ushort uVar19;
  undefined1 local_4a;
  undefined1 local_49;
  smf_t *local_48;
  char *local_40;
  uchar local_38 [8];
  
  smf_rewind(smf);
  if (smf->file_buffer != (void *)0x0) {
    __assert_fail("smf->file_buffer == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x1c3,"int pointers_are_clear(smf_t *)");
  }
  if (smf->file_buffer_length != 0) {
    __assert_fail("smf->file_buffer_length == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x1c4,"int pointers_are_clear(smf_t *)");
  }
  iVar17 = 1;
  while (iVar3 = smf->number_of_tracks, iVar17 <= iVar3) {
    psVar5 = smf_get_track_by_number(smf,iVar17);
    if (psVar5 == (smf_track_t *)0x0) {
      __assert_fail("track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x1c9,"int pointers_are_clear(smf_t *)");
    }
    if (psVar5->file_buffer != (void *)0x0) {
      __assert_fail("track->file_buffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x1ca,"int pointers_are_clear(smf_t *)");
    }
    iVar17 = iVar17 + 1;
    if (psVar5->file_buffer_length != 0) {
      __assert_fail("track->file_buffer_length == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x1cb,"int pointers_are_clear(smf_t *)");
    }
  }
  if (2 < (uint)smf->format) {
    pcVar15 = "SMF error: smf->format is less than zero of greater than two.";
LAB_0010e00f:
    g_log("libsmf",8,pcVar15);
    return -1;
  }
  if (iVar3 < 1) {
    pcVar15 = "SMF error: number of tracks is less than one.";
    goto LAB_0010e00f;
  }
  if (iVar3 != 1 && smf->format == 0) {
    pcVar15 = "SMF error: format is 0, but number of tracks is more than one.";
    goto LAB_0010e00f;
  }
  if (smf->ppqn < 1) {
    pcVar15 = "SMF error: PPQN has to be > 0.";
    goto LAB_0010e00f;
  }
  iVar17 = 1;
  local_40 = file_name;
  while (iVar17 <= iVar3) {
    local_48 = (smf_t *)CONCAT44(local_48._4_4_,iVar17);
    psVar5 = smf_get_track_by_number(smf,iVar17);
    if (psVar5 == (smf_track_t *)0x0) {
      __assert_fail("track",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x204,"int smf_validate(smf_t *)");
    }
    bVar1 = false;
    for (iVar17 = 1; iVar17 <= psVar5->number_of_events; iVar17 = iVar17 + 1) {
      psVar6 = smf_track_get_event_by_number(psVar5,iVar17);
      if (psVar6 == (smf_event_t *)0x0) {
        __assert_fail("event",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x20a,"int smf_validate(smf_t *)");
      }
      iVar3 = smf_event_is_valid(psVar6);
      if (iVar3 == 0) {
        g_log("libsmf",8,"Event #%d on track #%d is invalid.",iVar17,(ulong)local_48 & 0xffffffff);
        return -1;
      }
      iVar3 = smf_event_is_eot(psVar6);
      bVar2 = bVar1;
      if ((iVar3 != 0) && (bVar2 = true, bVar1)) {
        g_log("libsmf",8,"Duplicate End Of Track event on track #%d.",(ulong)local_48 & 0xffffffff);
        return -1;
      }
      bVar1 = bVar2;
    }
    if ((!bVar1) && (iVar17 = smf_track_add_eot_delta_pulses(psVar5,0), iVar17 != 0)) {
      g_log("libsmf",8,"smf_track_add_eot_delta_pulses failed.");
      return -1;
    }
    iVar3 = smf->number_of_tracks;
    iVar17 = (int)local_48 + 1;
  }
  iVar17 = smf->format;
  iVar4 = smf->ppqn;
  puVar7 = (undefined8 *)smf_extend(smf,0xe);
  if (puVar7 == (undefined8 *)0x0) {
    g_log("libsmf",8,"Cannot extend track buffer.");
    return -2;
  }
  uVar16 = (ushort)iVar4;
  uVar19 = (ushort)iVar17;
  *puVar7 = 0x60000006468544d;
  *(ushort *)(puVar7 + 1) = uVar19 << 8 | uVar19 >> 8;
  *(ushort *)((long)puVar7 + 10) = (ushort)iVar3 << 8 | (ushort)iVar3 >> 8;
  *(ushort *)((long)puVar7 + 0xc) = uVar16 << 8 | uVar16 >> 8;
  iVar17 = 1;
LAB_0010e0c4:
  puVar18 = local_38;
  if (iVar17 <= smf->number_of_tracks) {
    local_48 = (smf_t *)CONCAT44(local_48._4_4_,iVar17);
    psVar5 = smf_get_track_by_number(smf,iVar17);
    if (psVar5 == (smf_track_t *)0x0) {
      __assert_fail("track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x27a,"int smf_save(smf_t *, const char *)");
    }
    builtin_memcpy(local_38,"MTrk",4);
    psVar11 = psVar5;
    iVar17 = 8;
    do {
      iVar17 = track_append(psVar11,puVar18,iVar17);
LAB_0010e0fe:
      if (iVar17 != 0) {
LAB_0010e26a:
        free_buffer(smf);
        return -1;
      }
      psVar6 = smf_track_get_next_event(psVar5);
      if (psVar6 == (smf_event_t *)0x0) {
        if (psVar5->file_buffer == (void *)0x0) {
          __assert_fail("track->file_buffer != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x163,"int write_mtrk_length(smf_track_t *)");
        }
        if (psVar5->file_buffer_length < 6) {
          __assert_fail("track->file_buffer_length >= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x164,"int write_mtrk_length(smf_track_t *)");
        }
        uVar13 = psVar5->file_buffer_length - 8;
        *(uint *)((long)psVar5->file_buffer + 4) =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000
        ;
        iVar17 = (int)local_48 + 1;
        goto LAB_0010e0c4;
      }
      if ((long)psVar6->delta_time_pulses < 0) {
        __assert_fail("event->delta_time_pulses >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0xf6,"int write_event_time(smf_event_t *)");
      }
      iVar17 = write_vlq(psVar6,(long)psVar6->delta_time_pulses);
      if (iVar17 != 0) goto LAB_0010e26a;
      iVar17 = smf_event_is_system_realtime(psVar6);
      if ((iVar17 != 0) || (iVar17 = smf_event_is_system_common(psVar6), iVar17 != 0)) {
        local_4a = 0xf7;
        iVar3 = smf_event_is_sysex(psVar6);
        iVar17 = -1;
        if (iVar3 == 0) goto LAB_0010e1c9;
        local_49 = 0xf0;
        iVar3 = smf_event_is_sysex(psVar6);
        if (iVar3 == 0) {
          __assert_fail("smf_event_is_sysex(event)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x101,"int write_sysex_contents(smf_event_t *)");
        }
        iVar3 = track_append(psVar6->track,&local_49,1);
        if ((iVar3 == 0) &&
           (iVar3 = write_vlq(psVar6,(long)psVar6->midi_buffer_length - 1), iVar3 == 0)) {
          psVar11 = psVar6->track;
          puVar18 = psVar6->midi_buffer + 1;
          iVar17 = psVar6->midi_buffer_length + -1;
          goto LAB_0010e20f;
        }
        goto LAB_0010e0fe;
      }
      psVar11 = psVar6->track;
      puVar18 = psVar6->midi_buffer;
      iVar17 = psVar6->midi_buffer_length;
    } while( true );
  }
  __s = fopen(local_40,"wb+");
  if (__s == (FILE *)0x0) {
    iVar17 = -1;
    pcVar15 = "Cannot open input file: %s";
  }
  else {
    sVar8 = fwrite(smf->file_buffer,1,(long)smf->file_buffer_length,__s);
    if (sVar8 == (long)smf->file_buffer_length) {
      iVar17 = fclose(__s);
      if (iVar17 == 0) {
        iVar17 = 0;
        goto LAB_0010e33d;
      }
      iVar17 = -3;
      pcVar15 = "fclose(3) failed: %s";
    }
    else {
      pcVar15 = "fwrite(3) failed: %s";
      iVar17 = -2;
    }
  }
  piVar9 = __errno_location();
  pcVar10 = strerror(*piVar9);
  g_log("libsmf",8,pcVar15,pcVar10);
LAB_0010e33d:
  free_buffer(smf);
  if (iVar17 != 0) {
    return iVar17;
  }
  local_48 = smf_load(local_40);
  if (local_48 == (smf_t *)0x0) {
    __assert_fail("saved != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,600,"void assert_smf_saved_correctly(const smf_t *, const char *)");
  }
  if (smf->format != local_48->format) {
    __assert_fail("a->format == b->format",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x246,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->ppqn != local_48->ppqn) {
    __assert_fail("a->ppqn == b->ppqn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x247,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->frames_per_second != local_48->frames_per_second) {
    __assert_fail("a->frames_per_second == b->frames_per_second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x248,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->resolution != local_48->resolution) {
    __assert_fail("a->resolution == b->resolution",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x249,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  iVar17 = smf->number_of_tracks;
  if (iVar17 != local_48->number_of_tracks) {
    __assert_fail("a->number_of_tracks == b->number_of_tracks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x24a,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  iVar3 = 1;
  do {
    if (iVar17 < iVar3) {
      smf_delete(local_48);
      return 0;
    }
    psVar5 = smf_get_track_by_number(smf,iVar3);
    psVar11 = smf_get_track_by_number(local_48,iVar3);
    if (psVar5->track_number != psVar11->track_number) {
      __assert_fail("a->track_number == b->track_number",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x23a,
                    "void assert_smf_track_is_identical(const smf_track_t *, const smf_track_t *)");
    }
    if (psVar5->number_of_events != psVar11->number_of_events) {
      __assert_fail("a->number_of_events == b->number_of_events",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x23b,
                    "void assert_smf_track_is_identical(const smf_track_t *, const smf_track_t *)");
    }
    iVar17 = 1;
    while (iVar17 <= psVar5->number_of_events) {
      psVar6 = smf_track_get_event_by_number(psVar5,iVar17);
      psVar12 = smf_track_get_event_by_number(psVar11,iVar17);
      if (psVar6->event_number != psVar12->event_number) {
        __assert_fail("a->event_number == b->event_number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x22c,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      if (psVar6->delta_time_pulses != psVar12->delta_time_pulses) {
        __assert_fail("a->delta_time_pulses == b->delta_time_pulses",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x22d,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      uVar14 = psVar6->time_pulses - psVar12->time_pulses;
      uVar13 = -uVar14;
      if (0 < (int)uVar14) {
        uVar13 = uVar14;
      }
      if (2 < uVar13) {
        __assert_fail("abs(a->time_pulses - b->time_pulses) <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x22e,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      if (0.01 < ABS(psVar6->time_seconds - psVar12->time_seconds)) {
        __assert_fail("fabs(a->time_seconds - b->time_seconds) <= 0.01",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x22f,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      if (psVar6->track_number != psVar12->track_number) {
        __assert_fail("a->track_number == b->track_number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x230,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      if (psVar6->midi_buffer_length != psVar12->midi_buffer_length) {
        __assert_fail("a->midi_buffer_length == b->midi_buffer_length",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x231,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
      iVar4 = bcmp(psVar6->midi_buffer,psVar12->midi_buffer,(long)psVar6->midi_buffer_length);
      iVar17 = iVar17 + 1;
      if (iVar4 != 0) {
        __assert_fail("memcmp(a->midi_buffer, b->midi_buffer, a->midi_buffer_length) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x232,
                      "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                     );
      }
    }
    iVar3 = iVar3 + 1;
    iVar17 = smf->number_of_tracks;
  } while( true );
LAB_0010e1c9:
  iVar3 = track_append(psVar6->track,&local_4a,1);
  if ((iVar3 == 0) && (iVar3 = write_vlq(psVar6,(long)psVar6->midi_buffer_length), iVar3 == 0)) {
    psVar11 = psVar6->track;
    puVar18 = psVar6->midi_buffer;
    iVar17 = psVar6->midi_buffer_length;
LAB_0010e20f:
    iVar17 = track_append(psVar11,puVar18,iVar17);
    iVar17 = -(uint)(iVar17 != 0);
  }
  goto LAB_0010e0fe;
}

Assistant:

int
smf_save(smf_t *smf, const char *file_name)
{
	int i, error;
	smf_track_t *track;

	smf_rewind(smf);

	assert(pointers_are_clear(smf));

	if (smf_validate(smf))
		return (-1);

	if (write_mthd_header(smf))
		return (-2);

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track != NULL);

		error = write_track(track);
		if (error) {
			free_buffer(smf);
			return (error);
		}
	}

	error = write_file(smf, file_name);

	free_buffer(smf);

	if (error)
		return (error);

#ifndef NDEBUG
	assert_smf_saved_correctly(smf, file_name);
#endif

	return (0);
}